

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_ClientCAList_Test::TestBody(SSLTest_ClientCAList_Test *this)

{
  bool bVar1;
  SSL_METHOD *meth;
  pointer psVar2;
  char *pcVar3;
  SSL *pSVar4;
  pointer pXVar5;
  stack_st_X509_NAME *__p;
  pointer psVar6;
  X509_NAME *a;
  char *in_R9;
  AssertHelper local_280;
  Message local_278;
  int local_270 [2];
  undefined1 local_268 [8];
  AssertionResult gtest_ar_1;
  Message local_250;
  size_t local_248;
  uint local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar;
  AssertHelper local_208;
  Message local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__6;
  stack_st_X509_NAME *result;
  AssertHelper local_1c0;
  Message local_1b8;
  unique_ptr<X509_name_st,_bssl::internal::Deleter> local_1b0;
  bool local_1a1;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<struct_stack_st_X509_NAME> stack;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<X509_NAME> name_dup;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<X509_NAME> name;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<SSL> ssl;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> ctx;
  SSLTest_ClientCAList_Test *this_local;
  
  meth = (SSL_METHOD *)TLS_method();
  psVar2 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar_.message_,psVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x4d86cd,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x6c9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    pSVar4 = SSL_new((SSL_CTX *)psVar2);
    std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,(pointer)pSVar4);
    testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&name,(internal *)local_88,(AssertionResult *)0x4e465b,"false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x6cb,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&name);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      pXVar5 = (pointer)X509_NAME_new();
      std::unique_ptr<X509_name_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<X509_name_st,bssl::internal::Deleter> *)&gtest_ar__2.message_,pXVar5);
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<X509_name_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,
                 (type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&name_dup,(internal *)local_d0,(AssertionResult *)0x4deea4,"false",
                   "true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6ce,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&name_dup);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar1) {
        pXVar5 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                            &gtest_ar__2.message_);
        pXVar5 = (pointer)X509_NAME_dup((X509_NAME *)pXVar5);
        std::unique_ptr<X509_name_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<X509_name_st,bssl::internal::Deleter> *)&gtest_ar__3.message_,pXVar5)
        ;
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<X509_name_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_118,
                   (unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&stack,(internal *)local_118,(AssertionResult *)"name_dup","false",
                     "true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x6d1,pcVar3);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&stack);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (bVar1) {
          __p = sk_X509_NAME_new_null();
          std::unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter> *)&gtest_ar__4.message_
                     ,__p);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<stack_st_X509_NAME,bssl::internal::Deleter>>
                    ((AssertionResult *)local_160,
                     (unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> *)
                     &gtest_ar__4.message_,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_160,
                       (AssertionResult *)"stack","false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6d4,pcVar3);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_168);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          if (bVar1) {
            psVar6 = std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::get
                               ((unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> *)
                                &gtest_ar__4.message_);
            std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::unique_ptr
                      (&local_1b0,
                       (unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
            local_1a1 = PushToStack<stack_st_X509_NAME>(psVar6,&local_1b0);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_1a0,&local_1a1,(type *)0x0);
            std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr(&local_1b0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
            if (!bVar1) {
              testing::Message::Message(&local_1b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&result,(internal *)local_1a0,
                         (AssertionResult *)"PushToStack(stack.get(), std::move(name_dup))","false",
                         "true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x6d5,pcVar3);
              testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
              testing::internal::AssertHelper::~AssertHelper(&local_1c0);
              std::__cxx11::string::~string((string *)&result);
              testing::Message::~Message(&local_1b8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
            if (bVar1) {
              pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__1.message_);
              psVar6 = std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::release
                                 ((unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> *)
                                  &gtest_ar__4.message_);
              SSL_set_client_CA_list(pSVar4,(stack_st_X509_NAME *)psVar6);
              pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__1.message_);
              gtest_ar__6.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )SSL_get_client_CA_list(pSVar4);
              testing::AssertionResult::AssertionResult<stack_st_X509_NAME*>
                        ((AssertionResult *)local_1f8,(stack_st_X509_NAME **)&gtest_ar__6.message_,
                         (type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
              if (!bVar1) {
                testing::Message::Message(&local_200);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar.message_,(internal *)local_1f8,
                           (AssertionResult *)"result","false","true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_208,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x6db,pcVar3);
                testing::internal::AssertHelper::operator=(&local_208,&local_200);
                testing::internal::AssertHelper::~AssertHelper(&local_208);
                std::__cxx11::string::~string((string *)&gtest_ar.message_);
                testing::Message::~Message(&local_200);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
              if (bVar1) {
                local_23c = 1;
                local_248 = sk_X509_NAME_num((stack_st_X509_NAME *)
                                             gtest_ar__6.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl);
                testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                          ((EqHelper *)local_238,"1u","sk_X509_NAME_num(result)",&local_23c,
                           &local_248);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_238);
                if (!bVar1) {
                  testing::Message::Message(&local_250);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x6dc,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_1.message_,&local_250);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_1.message_);
                  testing::Message::~Message(&local_250);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
                if (bVar1) {
                  local_270[1] = 0;
                  a = sk_X509_NAME_value((stack_st_X509_NAME *)
                                         gtest_ar__6.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl,0);
                  pXVar5 = std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__2.message_);
                  local_270[0] = X509_NAME_cmp((X509_NAME *)a,(X509_NAME *)pXVar5);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_268,"0",
                             "X509_NAME_cmp(sk_X509_NAME_value(result, 0), name.get())",
                             local_270 + 1,local_270);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_268);
                  if (!bVar1) {
                    testing::Message::Message(&local_278);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_280,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x6dd,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_280,&local_278);
                    testing::internal::AssertHelper::~AssertHelper(&local_280);
                    testing::Message::~Message(&local_278);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
                }
              }
            }
          }
          std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> *)
                     &gtest_ar__4.message_);
        }
        std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
      std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, ClientCAList) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);
  bssl::UniquePtr<SSL> ssl(SSL_new(ctx.get()));
  ASSERT_TRUE(ssl);

  bssl::UniquePtr<X509_NAME> name(X509_NAME_new());
  ASSERT_TRUE(name);

  bssl::UniquePtr<X509_NAME> name_dup(X509_NAME_dup(name.get()));
  ASSERT_TRUE(name_dup);

  bssl::UniquePtr<STACK_OF(X509_NAME)> stack(sk_X509_NAME_new_null());
  ASSERT_TRUE(stack);
  ASSERT_TRUE(PushToStack(stack.get(), std::move(name_dup)));

  // |SSL_set_client_CA_list| takes ownership.
  SSL_set_client_CA_list(ssl.get(), stack.release());

  STACK_OF(X509_NAME) *result = SSL_get_client_CA_list(ssl.get());
  ASSERT_TRUE(result);
  ASSERT_EQ(1u, sk_X509_NAME_num(result));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(result, 0), name.get()));
}